

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O1

int vfio_epoll_wait(int epoll_fd,int maxevents,int timeout)

{
  __off_t __offset;
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  size_t sVar7;
  char *pcVar8;
  void *pvVar9;
  epoll_event *__events;
  undefined4 uVar10;
  char *__buf;
  undefined1 *puVar11;
  long lVar12;
  ulong unaff_R14;
  undefined8 auStack_2948 [2];
  size_t asStack_2938 [67];
  long lStack_2720;
  int iStack_2718;
  uint uStack_2714;
  undefined8 uStack_2710;
  undefined1 auStack_2708 [512];
  stat sStack_2508;
  char acStack_2478 [4096];
  char acStack_1478 [4096];
  ulong auStack_478 [3];
  epoll_event aeStack_45c [33];
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined1 local_238 [8];
  char buf [512];
  uint64_t val;
  
  lVar1 = -((ulong)(uint)maxevents * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)(local_238 + lVar1);
  *(undefined8 *)((long)&uStack_240 + lVar1) = 0x101e85;
  uVar2 = epoll_wait(epoll_fd,__events,maxevents,timeout);
  if (uVar2 != 0xffffffff) {
    unaff_R14 = (ulong)uVar2;
    if (0 < (int)uVar2) {
      lVar12 = 0;
      do {
        iVar3 = *(int *)(local_238 + lVar12 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_240 + lVar1) = 0x101eb5;
        sVar6 = read(iVar3,buf + 0x1f8,8);
        if (sVar6 == -1) {
          *(undefined8 *)((long)&uStack_240 + lVar1) = 0x101ee2;
          vfio_epoll_wait_cold_1();
          goto LAB_00101ee2;
        }
        lVar12 = lVar12 + 0xc;
      } while (unaff_R14 * 0xc != lVar12);
    }
    return uVar2;
  }
LAB_00101ee2:
  puVar11 = local_238;
  *(code **)((long)&uStack_240 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(undefined1 **)((long)&uStack_240 + lVar1) = &stack0xfffffffffffffff8;
  *(epoll_event **)((long)&uStack_248 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_45c + lVar1) = 1;
  *(int *)((long)aeStack_45c + lVar1 + 4) = (int)puVar11;
  *(undefined8 *)((long)auStack_478 + lVar1 + 0x10) = 0x101f0c;
  uVar2 = epoll_create1(0);
  if (uVar2 == 0xffffffff) {
    *(undefined8 *)((long)auStack_478 + lVar1 + 0x10) = 0x101f41;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar2;
    *(undefined8 *)((long)auStack_478 + lVar1 + 0x10) = 0x101f26;
    iVar3 = epoll_ctl(uVar2,1,(int)puVar11,(epoll_event *)((long)aeStack_45c + lVar1));
    if (iVar3 != -1) {
      return uVar2;
    }
  }
  lVar12 = (long)aeStack_45c + lVar1 + 0xc;
  *(code **)((long)auStack_478 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_478 + lVar1 + 0x10) = (ulong)puVar11 & 0xffffffff;
  *(ulong *)((long)auStack_478 + lVar1 + 8) = unaff_R14;
  *(epoll_event **)((long)auStack_478 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x101f7a;
  snprintf(acStack_1478 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar12);
  *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x101f8a;
  iVar3 = stat(acStack_1478 + lVar1,(stat *)((long)&sStack_2508 + lVar1));
  if (iVar3 < 0) {
    return -1;
  }
  pcVar8 = acStack_1478 + lVar1;
  *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x101fa2;
  sVar7 = strlen(pcVar8);
  *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x101fb9;
  strncat(pcVar8,"iommu_group",0xfff - sVar7);
  __buf = acStack_2478 + lVar1;
  *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x101fce;
  sVar6 = readlink(pcVar8,__buf,0x1000);
  uVar10 = SUB84(__buf,0);
  if (sVar6 == -1) {
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102160;
    vfio_init_cold_11();
LAB_00102160:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x10216a;
    vfio_init_cold_10();
LAB_0010216a:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102174;
    vfio_init_cold_8();
LAB_00102174:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x10217e;
    vfio_init_cold_7();
LAB_0010217e:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102188;
    vfio_init_cold_6();
LAB_00102188:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102192;
    vfio_init_cold_5();
LAB_00102192:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x10219c;
    vfio_init_cold_3();
LAB_0010219c:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x1021a6;
    vfio_init_cold_9();
LAB_001021a6:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x1021b0;
    vfio_init_cold_1();
LAB_001021b0:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x1021ba;
    vfio_init_cold_2();
  }
  else {
    acStack_2478[(int)sVar6 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x101fef;
    pcVar8 = __xpg_basename(acStack_2478 + lVar1);
    uVar10 = 0x1034ad;
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102005;
    iVar3 = __isoc99_sscanf(pcVar8,"%d",(long)&uStack_2714 + lVar1);
    if (iVar3 == -1) goto LAB_00102160;
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102015;
    iVar3 = get_vfio_container();
    *(int *)((long)&iStack_2718 + lVar1) = iVar3;
    if (iVar3 == -1) {
      uVar10 = 2;
      *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102032;
      iVar4 = open("/dev/vfio/vfio",2);
      if (iVar4 == -1) goto LAB_0010219c;
      *(int *)((long)&iStack_2718 + lVar1) = iVar4;
      *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102045;
      set_vfio_container(iVar4);
      uVar10 = 0x3b64;
      *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102054;
      iVar4 = ioctl(*(int *)((long)&iStack_2718 + lVar1),0x3b64);
      if (iVar4 != 0) goto LAB_001021a6;
      uVar10 = 0x3b65;
      *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102070;
      iVar4 = ioctl(*(int *)((long)&iStack_2718 + lVar1),0x3b65,1);
      if (iVar4 == 1) goto LAB_00102079;
      goto LAB_001021b0;
    }
LAB_00102079:
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x10209b;
    snprintf(acStack_1478 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_2714 + lVar1)
            );
    uVar10 = 2;
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x1020aa;
    iVar4 = open(acStack_1478 + lVar1,2);
    if (iVar4 == -1) goto LAB_0010216a;
    *(undefined8 *)((long)&uStack_2710 + lVar1) = 8;
    uVar10 = 0x3b67;
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x1020d0;
    iVar5 = ioctl(iVar4,0x3b67);
    if (iVar5 == -1) goto LAB_00102174;
    if ((auStack_2708[lVar1 + -4] & 1) == 0) goto LAB_0010217e;
    uVar10 = 0x3b68;
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x1020f6;
    iVar5 = ioctl(iVar4,0x3b68,(long)&iStack_2718 + lVar1);
    if (iVar5 == -1) goto LAB_00102188;
    if (iVar3 != -1) {
LAB_00102121:
      uVar10 = 0x3b6a;
      *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102133;
      iVar3 = ioctl(iVar4,0x3b6a,lVar12);
      if (iVar3 != -1) {
        *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102141;
        vfio_enable_dma(iVar3);
        return iVar3;
      }
      goto LAB_00102192;
    }
    uVar10 = 0x3b66;
    *(undefined8 *)((long)&lStack_2720 + lVar1) = 0x102118;
    iVar3 = ioctl(*(int *)((long)&iStack_2718 + lVar1),0x3b66,1);
    if (iVar3 != -1) goto LAB_00102121;
  }
  iVar3 = (int)auStack_2708 + (int)lVar1;
  *(code **)((long)&lStack_2720 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_2720 + lVar1) = lVar12;
  *(undefined8 *)((long)auStack_2948 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_2938 + lVar1) = 0;
  *(undefined8 *)((long)asStack_2938 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_2938 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_2938 + lVar1) = uVar10;
  *(undefined8 *)((long)auStack_2948 + lVar1) = 0x1021ef;
  iVar4 = ioctl(iVar3,0x3b6c);
  if (iVar4 != -1) {
    sVar7 = *(size_t *)((long)asStack_2938 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_2938 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_2948 + lVar1) = 0x102212;
    pvVar9 = mmap((void *)0x0,sVar7,3,1,iVar3,__offset);
    if (pvVar9 != (void *)0xffffffffffffffff) goto LAB_00102229;
    *(undefined8 *)((long)auStack_2948 + lVar1) = 0x102222;
    vfio_map_region_cold_1();
  }
  pvVar9 = (void *)0xffffffffffffffff;
LAB_00102229:
  return (int)pvVar9;
}

Assistant:

int vfio_epoll_wait(int epoll_fd, int maxevents, int timeout) {
	struct epoll_event events[maxevents];
	int rc;

	while (1) {
		// Waiting for packets
		rc = (int) check_err(epoll_wait(epoll_fd, events, maxevents, timeout), "to handle epoll wait");
		if (rc > 0) {
			/* epoll_wait has at least one fd ready to read */
			for (int i = 0; i < rc; i++) {
				uint64_t val;
				// read event file descriptor to clear interrupt.
				check_err(read(events[i].data.fd, &val, sizeof(val)), "to read event");
			}
			break;
		} else {
			/* rc == 0, epoll_wait timed out */
			break;
		}
	}

	return rc;
}